

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

bool __thiscall libcellml::UnitsItem::isValid(UnitsItem *this)

{
  int iVar1;
  UnitsItemImpl *pUVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Units *this_01;
  ulong uVar3;
  _Atomic_word _Var4;
  size_t sVar5;
  bool bVar6;
  
  pUVar2 = this->mPimpl;
  this_00 = (pUVar2->mUnits).super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00251753:
    bVar6 = false;
  }
  else {
    _Var4 = this_00->_M_use_count;
    do {
      if (_Var4 == 0) goto LAB_00251753;
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar6 = _Var4 == iVar1;
      if (bVar6) {
        this_00->_M_use_count = _Var4 + 1;
        iVar1 = _Var4;
      }
      _Var4 = iVar1;
      UNLOCK();
    } while (!bVar6);
    this_01 = (pUVar2->mUnits).super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (this_01 == (Units *)0x0 || this_00->_M_use_count == 0) {
      bVar6 = false;
    }
    else {
      uVar3 = this->mPimpl->mIndex;
      sVar5 = Units::unitCount(this_01);
      bVar6 = uVar3 < sVar5;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return bVar6;
}

Assistant:

bool UnitsItem::isValid() const
{
    auto units = mPimpl->mUnits.lock();
    if (units != nullptr) {
        return mPimpl->mIndex < units->unitCount();
    }

    return false;
}